

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSuper.c
# Opt level: O3

char * Map_LibraryReadFormulaStep(char *pFormula,char **pStrings,int *pnStrings)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  
  for (; cVar4 = *pFormula, cVar4 == ' '; pFormula = pFormula + 1) {
  }
  pcVar2 = pFormula;
  if (cVar4 == '\0') {
    __assert_fail("*pName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                  ,0x107,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
  }
  do {
    pcVar1 = pcVar2 + 1;
    if (cVar4 == '\0') {
      lVar3 = 0;
LAB_00400ac4:
      *pnStrings = (int)lVar3;
      return pFormula;
    }
    if (cVar4 == '(') {
      *pcVar2 = '\0';
      cVar4 = *pcVar1;
      if (cVar4 != '\0') {
        iVar5 = 1;
        do {
          if (cVar4 == ')') {
            iVar5 = iVar5 + -1;
          }
          else if (cVar4 == '(') {
            iVar5 = iVar5 + 1;
          }
          cVar4 = pcVar2[2];
          pcVar2 = pcVar2 + 1;
        } while ((cVar4 != '\0') && (iVar5 != 0));
        if (iVar5 == 0) {
          if (*pcVar2 != ')') {
            __assert_fail("*pPar2 == \')\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                          ,0x11b,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
          }
          *pcVar2 = '\0';
          *pStrings = pcVar1;
          cVar4 = *pcVar1;
          if (cVar4 == '\0') {
            lVar3 = 1;
          }
          else {
            lVar3 = 1;
            do {
              iVar5 = 0;
              pcVar2 = pcVar1;
              while ((pcVar1 = pcVar2 + 1, iVar5 != 0 || (cVar4 != ','))) {
                if (cVar4 == ')') {
                  iVar5 = iVar5 + -1;
                }
                else if (cVar4 == '(') {
                  iVar5 = iVar5 + 1;
                }
                cVar4 = *pcVar1;
                pcVar2 = pcVar1;
                if (cVar4 == '\0') goto LAB_00400ac4;
              }
              *pcVar2 = '\0';
              pStrings[lVar3] = pcVar1;
              lVar3 = lVar3 + 1;
              cVar4 = *pcVar1;
            } while (cVar4 != '\0');
          }
          goto LAB_00400ac4;
        }
      }
      __assert_fail("CountPars == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                    ,0x119,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
    }
    cVar4 = *pcVar1;
    pcVar2 = pcVar1;
  } while( true );
}

Assistant:

char * Map_LibraryReadFormulaStep( char * pFormula, char * pStrings[], int * pnStrings )
{
    char * pName, * pPar1, * pPar2, * pCur;
    int nStrings, CountPars;

    // skip leading spaces
    for ( pName = pFormula; *pName && *pName == ' '; pName++ );
    assert( *pName );
    // find the first opening parenthesis
    for ( pPar1 = pName; *pPar1 && *pPar1 != '('; pPar1++ );
    if ( *pPar1 == 0 )
    {
        *pnStrings = 0;
        return pName;
    }
    // overwrite it with space
    assert( *pPar1 == '(' );
    *pPar1 = 0;
    // find the corresponding closing parenthesis
    for ( CountPars = 1, pPar2 = pPar1 + 1; *pPar2 && CountPars; pPar2++ )
        if ( *pPar2 == '(' )
            CountPars++;
        else if ( *pPar2 == ')' )
            CountPars--;
    pPar2--;
    assert( CountPars == 0 );
    // overwrite it with space
    assert( *pPar2 == ')' );
    *pPar2 = 0;
    // save the intervals between the commas
    nStrings = 0;
    pCur = pPar1 + 1;
    while ( 1 )
    {
        // save the current string
        pStrings[ nStrings++ ] = pCur;
        // find the beginning of the next string
        for ( CountPars = 0; *pCur && (CountPars || *pCur != ','); pCur++ )
            if ( *pCur == '(' )
                CountPars++;
            else if ( *pCur == ')' )
                CountPars--;
        if ( *pCur == 0 )
            break;
        assert( *pCur == ',' );
        *pCur = 0;
        pCur++;
    }
    // save the results and return
    *pnStrings = nStrings;
    return pName;
}